

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O1

int Unm_ManPrintPairStats(Hash_IntMan_t *pHash,int nTotal0,int nPairs0,int nPairs1,int fUseLit)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  int Counter [21];
  int local_88 [22];
  
  local_88[0x10] = 0;
  local_88[0x11] = 0;
  local_88[0x12] = 0;
  local_88[0x13] = 0;
  local_88[0xc] = 0;
  local_88[0xd] = 0;
  local_88[0xe] = 0;
  local_88[0xf] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0x14] = 0;
  pVVar2 = pHash->vObjs;
  uVar1 = pVVar2->nSize;
  uVar8 = 0;
  iVar7 = 0;
  if (7 < (long)(int)uVar1) {
    uVar4 = 2;
    if (2 < uVar1 >> 2) {
      uVar4 = uVar1 >> 2;
    }
    iVar7 = 0;
    uVar5 = 4;
    uVar8 = 0;
    do {
      if ((ulong)(long)(int)uVar1 <= uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar3 = pVVar2->pArray[uVar5 + 2];
      iVar6 = 0x14;
      if (iVar3 < 0x14) {
        iVar6 = iVar3;
      }
      local_88[iVar6] = local_88[iVar6] + 1;
      iVar7 = iVar7 + iVar6;
      uVar8 = uVar8 + (1 < iVar3);
      uVar5 = uVar5 + 4;
    } while (uVar4 << 2 != uVar5);
  }
  puts("Statistics for pairs appearing less than 20 times:");
  iVar3 = 1;
  if (1 < iVar7) {
    iVar3 = iVar7;
  }
  uVar5 = 0;
  do {
    if (0 < local_88[uVar5]) {
      printf("%3d : %7d  %7.2f %%\n",
             SUB84(((double)(int)uVar5 * (double)local_88[uVar5] * 100.0) / (double)iVar3,0),
             uVar5 & 0xffffffff);
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x15);
  iVar7 = 1;
  if (1 < nTotal0) {
    iVar7 = nTotal0;
  }
  dVar9 = (double)iVar7;
  printf("Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n"
         ,SUB84(((double)nPairs0 * 100.0) / dVar9,0),((double)(int)uVar8 * 100.0) / dVar9,
         ((double)nPairs1 * 100.0) / dVar9,(ulong)(uint)nTotal0,(ulong)(uint)nPairs0,(ulong)uVar8,
         (ulong)(uint)nPairs1);
  return uVar8;
}

Assistant:

int Unm_ManPrintPairStats( Hash_IntMan_t * pHash, int nTotal0, int nPairs0, int nPairs1, int fUseLit )
{
    int i, Num, nRefs, nPairs = 0, nTotal = 0, Counter[21] = {0};
    Num = Hash_IntManEntryNum( pHash );
    for ( i = 1; i <= Num; i++ )
    {
        nRefs = Abc_MinInt( 20, Hash_IntObjData2(pHash, i) );
        nTotal += nRefs;
        Counter[nRefs]++;
        nPairs += (nRefs > 1);
/*
        if ( fUseLit )
            printf( "(%c%c, %c%c) %d\n", 
                Abc_LitIsCompl(Hash_IntObjData0(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData0(pHash, i)-2), 
                Abc_LitIsCompl(Hash_IntObjData1(pHash, i)-2) ? '!' : ' ', 
                'a' + Abc_Lit2Var(Hash_IntObjData1(pHash, i)-2), nRefs );
        else
            printf( "( %c,  %c) %d\n", 
                'a' + Hash_IntObjData0(pHash, i)-1, 
                'a' + Hash_IntObjData1(pHash, i)-1, nRefs );
*/
//        printf( "(%4d, %4d) %d\n", Hash_IntObjData0(pHash, i), Hash_IntObjData1(pHash, i), nRefs );

    }
    printf( "Statistics for pairs appearing less than 20 times:\n" );
    for ( i = 0; i < 21; i++ )
        if ( Counter[i] > 0 )
            printf( "%3d : %7d  %7.2f %%\n", i, Counter[i], 100.0 * Counter[i] * i / Abc_MaxInt(nTotal, 1) );
    printf( "Pairs:  Total = %8d    Init = %8d %7.2f %%    Final = %8d %7.2f %%    Real = %8d %7.2f %%\n", nTotal0, 
        nPairs0,  100.0 * nPairs0 / Abc_MaxInt(nTotal0, 1), 
        nPairs, 100.0 * nPairs / Abc_MaxInt(nTotal0, 1), 
        nPairs1, 100.0 * nPairs1 / Abc_MaxInt(nTotal0, 1) );
    return nPairs;
}